

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O0

void mp::WriteJSON(JSONW *jw,PLConParams *plp)

{
  PLPoints *pPVar1;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  PLPoints *p;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff68;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffff70;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *this;
  char *in_stack_ffffffffffffff78;
  PLConParams *in_stack_ffffffffffffffa0;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  
  pPVar1 = PLConParams::GetPLPoints(in_stack_ffffffffffffffa0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,in_stack_ffffffffffffff78);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2d6db8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_RDI,(char *)&pPVar1->y_);
  this = (MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
         &stack0xffffffffffffffa8;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>::operator=
            (this,in_stack_ffffffffffffff68);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2d6e13);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const PLConParams& plp) {
  const auto& p = plp.GetPLPoints();
  jw["pl_x"] = p.x_;
  jw["pl_y"] = p.y_;
}